

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FZFile.cpp
# Opt level: O1

string * __thiscall
FZFile::fz_key_to_string<44ul>
          (string *__return_storage_ptr__,FZFile *this,array<unsigned_int,_44UL> *fzkey)

{
  long lVar1;
  char cVar2;
  char cVar3;
  size_t j;
  long lVar4;
  ulong uVar5;
  bool bVar6;
  stringstream sstr;
  stringstream local_1b8 [16];
  long local_1a8 [2];
  undefined8 uStack_198;
  uint auStack_190 [22];
  ios_base local_138 [112];
  char acStack_c8 [152];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  uVar5 = 0;
  do {
    lVar4 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," 0x",3);
      lVar1 = *(long *)(local_1a8[0] + -0x18);
      cVar2 = (char)(ostream *)local_1a8;
      if (acStack_c8[lVar1 + 1] == '\0') {
        cVar3 = std::ios::widen(cVar2 + (char)lVar1);
        acStack_c8[lVar1] = cVar3;
        acStack_c8[lVar1 + 1] = '\x01';
      }
      acStack_c8[lVar1] = '0';
      *(undefined8 *)((long)&uStack_198 + *(long *)(local_1a8[0] + -0x18)) = 8;
      *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
           *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 8;
      std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      lVar4 = lVar4 + 1;
    } while (lVar4 != 4);
    std::ios::widen((char)*(undefined8 *)(local_1a8[0] + -0x18) + cVar2);
    std::ostream::put(cVar2);
    std::ostream::flush();
    bVar6 = uVar5 < 0x28;
    uVar5 = uVar5 + 4;
  } while (bVar6);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string FZFile::fz_key_to_string(const std::array<uint32_t, N> &fzkey) {
	std::stringstream sstr;
	for (size_t i = 0; i < N; i += 4) {
		for (size_t j = 0; j < 4; j++) {
			sstr << " 0x" << std::setfill ('0') << std::setw(8) << std::hex << fzkey[i + j];
		}
		sstr << std::endl;
	}
	return sstr.str();
}